

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O0

void readRgba2(char *fileName)

{
  int iVar1;
  Rgba *pRVar2;
  char *in_RDI;
  Array2D<Imf_3_2::Rgba> pixels;
  int width;
  Box2i dw;
  RgbaInputFile file;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar3;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff50;
  int local_84 [5];
  long in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff9c;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffffa0;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  Rgba local_48 [9];
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_48,in_RDI,iVar1);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_ffffffffffffff50,
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  iVar1 = (local_50 - local_58) + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,iVar1),
             in_stack_ffffffffffffff90);
  for (; local_54 <= local_4c; local_54 = local_54 + 10) {
    pRVar2 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]((Array2D<Imf_3_2::Rgba> *)(local_84 + 1),0)
    ;
    Imf_3_2::RgbaInputFile::setFrameBuffer
              (local_48,(ulong)(pRVar2 + (-(long)local_58 - (long)(local_54 * iVar1))),1);
    local_84[0] = local_54 + 9;
    iVar3 = local_54;
    in_stack_ffffffffffffff50 = (Array2D<Imf_3_2::Rgba> *)std::min<int>(local_84,&local_4c);
    Imf_3_2::RgbaInputFile::readPixels((int)local_48,iVar3);
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_ffffffffffffff50);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_48);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    //
    // Read an RGBA image using class RgbaInputFile.
    // Read the pixels, 10 scan lines at a time, and
    // store the pixel data in a buffer that is just
    // large enough to hold 10 scan lines worth of data.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- for each block of 10 scan lines,
    //	  describe the memory layout of the pixels,
    //	  read the pixels from the file,
    //	  process the pixels and discard them
    //

    RgbaInputFile file (fileName);
    Box2i         dw = file.dataWindow ();

    int width = dw.max.x - dw.min.x + 1;

    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
        file.setFrameBuffer (
            &pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);

        file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));
        // processPixels (pixels)

        dw.min.y += 10;
    }
}